

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void Imf_2_5::anon_unknown_7::writePixelData
               (OutputStreamMutex *filedata,Data *partdata,int lineBufferMinY,char *pixelData,
               int pixelDataSize)

{
  int iVar1;
  undefined4 extraout_var;
  int local_3c;
  int local_38;
  int local_34;
  unsigned_long uVar2;
  
  uVar2 = filedata->currentPosition;
  filedata->currentPosition = 0;
  if (uVar2 == 0) {
    iVar1 = (*filedata->os->_vptr_OStream[3])();
    uVar2 = CONCAT44(extraout_var,iVar1);
  }
  (partdata->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start
  [(partdata->currentScanLine - partdata->minY) / partdata->linesInBuffer] = uVar2;
  if (partdata->multiPart == true) {
    local_3c = partdata->partNumber;
    (*filedata->os->_vptr_OStream[2])(filedata->os,&local_3c,4);
  }
  local_38 = lineBufferMinY;
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_38,4);
  local_34 = pixelDataSize;
  (*filedata->os->_vptr_OStream[2])(filedata->os,&local_34,4);
  (*filedata->os->_vptr_OStream[2])(filedata->os,pixelData,(ulong)(uint)pixelDataSize);
  filedata->currentPosition = (long)pixelDataSize + uVar2 + 8;
  if (partdata->multiPart == true) {
    filedata->currentPosition = (long)pixelDataSize + uVar2 + 0xc;
  }
  return;
}

Assistant:

void
writePixelData (OutputStreamMutex *filedata,
                OutputFile::Data *partdata,
                int lineBufferMinY,
                const char pixelData[],
                int pixelDataSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file
    // without calling tellp() (tellp() can be fairly expensive).
    //

    Int64 currentPosition = filedata->currentPosition;
    filedata->currentPosition = 0;

    if (currentPosition == 0)
        currentPosition = filedata->os->tellp();

    partdata->lineOffsets[(partdata->currentScanLine - partdata->minY) / partdata->linesInBuffer] =
        currentPosition;

    #ifdef DEBUG

        assert (filedata->os->tellp() == currentPosition);

    #endif
    
	
	
    if (partdata->multiPart)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, partdata->partNumber);
    }
    
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, lineBufferMinY);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*filedata->os, pixelDataSize);
    filedata->os->write (pixelData, pixelDataSize);

    filedata->currentPosition = currentPosition +
                           Xdr::size<int>() +
                           Xdr::size<int>() +
                           pixelDataSize;

    if (partdata->multiPart)
    {
        filedata->currentPosition += Xdr::size<int>();
    }
}